

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O3

int match1vs1(int matches,long limit,string *command1,string *command2)

{
  int *piVar1;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  _State_baseV2 *__tmp_2;
  mapped_type *pmVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Result_base *p_Var7;
  undefined8 *puVar8;
  bool bVar9;
  long lVar10;
  int i;
  int iVar11;
  future<void> *this;
  bool bVar12;
  long lVar13;
  int iVar14;
  _State_baseV2 *__tmp_1;
  _State_baseV2 *__tmp;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> allServersThreads;
  int wins [4];
  int ties [4];
  Forth forth2;
  Forth forth1;
  __state_type local_10e8;
  element_type *local_10d8;
  _func_int **local_10d0 [2];
  __basic_future<void> local_10c0;
  long *local_10b0;
  long *local_10a8;
  int local_109c;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> local_1098;
  string *local_1078;
  string *local_1070;
  undefined8 local_1068;
  ulong local_1058;
  long local_1050;
  undefined8 local_1048 [3];
  Forth local_1030;
  Forth local_830;
  
  LOCK();
  stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  local_1068._4_4_ = 0;
  r_debug = 0;
  local_1068 = 0;
  local_1048[0] = 0;
  local_1068._0_4_ = 0;
  if (0 < matches) {
    local_1058 = 1;
    local_109c = matches;
    local_1078 = command2;
    local_1070 = command1;
    local_1050 = limit;
LAB_0010f07d:
    cppforth::Forth::Forth(&local_830);
    InitForthRobot(&local_830,step);
    local_1030._0_8_ = &local_830;
    pmVar5 = std::
             map<const_cppforth::Forth_*,_int,_std::less<const_cppforth::Forth_*>,_std::allocator<std::pair<const_cppforth::Forth_*const,_int>_>_>
             ::operator[](&Forth2Int,(key_type *)&local_1030);
    *pmVar5 = 0;
    cppforth::Forth::Forth(&local_1030);
    InitForthRobot(&local_1030,step);
    local_1098.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_1030;
    pmVar5 = std::
             map<const_cppforth::Forth_*,_int,_std::less<const_cppforth::Forth_*>,_std::allocator<std::pair<const_cppforth::Forth_*const,_int>_>_>
             ::operator[](&Forth2Int,(key_type *)&local_1098);
    *pmVar5 = 1;
    local_1098.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_start = (future<void> *)0x0;
    local_1098.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (future<void> *)0x0;
    local_1098.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    p_Var6->_M_use_count = 1;
    p_Var6->_M_weak_count = 1;
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00157690;
    local_10d8 = (element_type *)(p_Var6 + 1);
    p_Var6[1]._M_use_count = 0;
    p_Var6[1]._M_weak_count = 0;
    *(undefined4 *)&p_Var6[2]._vptr__Sp_counted_base = 0;
    *(undefined1 *)((long)&p_Var6[2]._vptr__Sp_counted_base + 4) = 0;
    p_Var6[2]._M_use_count = 0;
    p_Var6[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var6[3]._M_use_count = 0;
    p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_001576e0;
    p_Var7 = (_Result_base *)operator_new(0x10);
    *(undefined8 *)p_Var7 = 0;
    *(undefined8 *)(p_Var7 + 8) = 0;
    std::__future_base::_Result_base::_Result_base(p_Var7);
    *(undefined ***)p_Var7 = &PTR__M_destroy_00157cd8;
    p_Var6[4]._vptr__Sp_counted_base = (_func_int **)p_Var7;
    *(Forth **)&p_Var6[4]._M_use_count = &local_830;
    p_Var6[5]._vptr__Sp_counted_base = (_func_int **)local_1070;
    local_10d0[0] = (_func_int **)0x0;
    local_10b0 = (long *)operator_new(0x20);
    peVar2 = local_10d8;
    *local_10b0 = (long)&PTR___State_00157738;
    local_10b0[1] = (long)local_10d8;
    local_10b0[2] =
         (long)std::__future_base::
               _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:445:15)>_>,_void>
               ::_M_run;
    local_10b0[3] = 0;
    std::thread::_M_start_thread(local_10d0,&local_10b0,0);
    if (local_10b0 != (long *)0x0) {
      (**(code **)(*local_10b0 + 8))();
    }
    if (p_Var6[3]._vptr__Sp_counted_base == (_func_int **)0x0) {
      p_Var6[3]._vptr__Sp_counted_base = local_10d0[0];
      local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var6;
      std::__basic_future<void>::__basic_future(&local_10c0,&local_10e8);
      if (local_10e8.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_10e8.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_1098,
                 (future<void> *)&local_10c0);
      if (local_10c0._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_10c0._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
      p_Var6->_M_use_count = 1;
      p_Var6->_M_weak_count = 1;
      p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00157810;
      local_10d8 = (element_type *)(p_Var6 + 1);
      p_Var6[1]._M_use_count = 0;
      p_Var6[1]._M_weak_count = 0;
      *(undefined4 *)&p_Var6[2]._vptr__Sp_counted_base = 0;
      *(undefined1 *)((long)&p_Var6[2]._vptr__Sp_counted_base + 4) = 0;
      p_Var6[2]._M_use_count = 0;
      p_Var6[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var6[3]._M_use_count = 0;
      p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00157860;
      p_Var7 = (_Result_base *)operator_new(0x10);
      *(undefined8 *)p_Var7 = 0;
      *(undefined8 *)(p_Var7 + 8) = 0;
      std::__future_base::_Result_base::_Result_base(p_Var7);
      *(undefined ***)p_Var7 = &PTR__M_destroy_00157cd8;
      p_Var6[4]._vptr__Sp_counted_base = (_func_int **)p_Var7;
      *(Forth **)&p_Var6[4]._M_use_count = &local_1030;
      p_Var6[5]._vptr__Sp_counted_base = (_func_int **)local_1078;
      local_10d0[0] = (_func_int **)0x0;
      local_10a8 = (long *)operator_new(0x20);
      *local_10a8 = (long)&PTR___State_001578b8;
      local_10a8[1] = (long)local_10d8;
      local_10a8[2] =
           (long)std::__future_base::
                 _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/ForthRobots.cpp:457:15)>_>,_void>
                 ::_M_run;
      local_10a8[3] = 0;
      std::thread::_M_start_thread(local_10d0,&local_10a8,0);
      if (local_10a8 != (long *)0x0) {
        (**(code **)(*local_10a8 + 8))();
      }
      if (p_Var6[3]._vptr__Sp_counted_base == (_func_int **)0x0) {
        p_Var6[3]._vptr__Sp_counted_base = local_10d0[0];
        local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_10d8;
        local_10e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = p_Var6;
        std::__basic_future<void>::__basic_future(&local_10c0,&local_10e8);
        if (local_10e8.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_10e8.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        std::vector<std::future<void>,std::allocator<std::future<void>>>::
        emplace_back<std::future<void>>
                  ((vector<std::future<void>,std::allocator<std::future<void>>> *)&local_1098,
                   (future<void> *)&local_10c0);
        if (local_10c0._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_10c0._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        init_robot(0);
        robots[0].status = 1;
        init_robot(1);
        robots[1].status = 1;
        rand_pos(2);
        if (0 < limit) {
          iVar11 = 0xf;
          local_10d8 = (element_type *)0x0;
          do {
            lVar10 = 0;
            iVar14 = 0;
            bVar3 = true;
            do {
              bVar4 = bVar3;
              if (robots[lVar10].status == 1) {
                cur_robot = robots + lVar10;
                iVar14 = iVar14 + 1;
              }
              lVar10 = 1;
              bVar3 = false;
            } while (bVar4);
            cycle(2);
            iVar11 = iVar11 + -1;
            if (iVar11 == 0) {
              move_robots(0);
              move_miss(0);
              local_10d8 = (element_type *)
                           ((long)&(local_10d8->_M_result)._M_t.
                                   super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
                                   .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>
                                   ._M_head_impl + 7);
              lVar10 = 0;
              bVar3 = true;
              do {
                bVar4 = bVar3;
                lVar13 = 0;
                bVar3 = true;
                do {
                  bVar12 = bVar3;
                  if (missiles[lVar10][lVar13].stat == 2) {
                    count_miss((int)lVar10,(int)lVar13);
                  }
                  lVar13 = 1;
                  bVar3 = false;
                } while (bVar12);
                lVar10 = 1;
                bVar3 = false;
              } while (bVar4);
              iVar11 = 0xf;
              limit = local_1050;
            }
          } while ((1 < iVar14) && ((long)local_10d8 < limit));
        }
        lVar10 = 0;
        bVar3 = true;
        bVar4 = false;
        do {
          lVar13 = 0;
          bVar12 = true;
          do {
            bVar9 = bVar12;
            if (missiles[lVar10][lVar13].stat == 1) {
              bVar4 = true;
            }
            lVar13 = 1;
            bVar12 = false;
          } while (bVar9);
          lVar10 = 1;
          if (!bVar3) {
            if (!bVar4) goto LAB_0010f4fa;
            move_robots(0);
            bVar4 = false;
            move_miss(0);
            lVar10 = 0;
          }
          bVar3 = (bool)(bVar3 ^ 1);
        } while( true );
      }
    }
    std::terminate();
  }
LAB_0010f958:
  iVar11 = 1;
  if ((int)local_1068 <= local_1068._4_4_) {
    iVar11 = -(uint)((int)local_1068 < local_1068._4_4_);
  }
  return iVar11;
LAB_0010f4fa:
  lVar10 = 0;
  iVar11 = 0;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    iVar11 = iVar11 + (uint)(robots[lVar10].status == 1);
    lVar10 = 1;
    bVar3 = false;
  } while (bVar4);
  puVar8 = local_1048;
  if (iVar11 == 1) {
    puVar8 = &local_1068;
  }
  lVar10 = 0;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    if (robots[lVar10].status == 1) {
      piVar1 = (int *)((long)puVar8 + lVar10 * 4);
      *piVar1 = *piVar1 + 1;
    }
    lVar10 = 1;
    iVar11 = 0;
    bVar3 = false;
  } while (bVar4);
  LOCK();
  stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
  UNLOCK();
  do {
    lVar10 = 0;
    bVar3 = true;
    bVar4 = true;
    do {
      bVar12 = bVar4;
      bVar3 = (bool)(bVar3 & robotStatus[lVar10] == StatusException);
      lVar10 = 1;
      bVar4 = false;
    } while (bVar12);
    this = local_1098.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    if (bVar3) break;
    cycle(2);
    sched_yield();
    iVar11 = iVar11 + 1;
    this = local_1098.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  } while (iVar11 != 10000);
  for (; this != local_1098.
                 super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
                 super__Vector_impl_data._M_finish; this = this + 1) {
    std::future<void>::get(this);
  }
  LOCK();
  stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&local_1098);
  cppforth::Forth::~Forth(&local_1030);
  cppforth::Forth::~Forth(&local_830);
  iVar11 = (int)local_1058;
  local_1058 = (ulong)(iVar11 + 1);
  if (iVar11 == local_109c) goto LAB_0010f94a;
  goto LAB_0010f07d;
LAB_0010f94a:
  goto LAB_0010f958;
}

Assistant:

int match1vs1(int matches,
	long limit,
	const std::string &command1,
	const std::string &command2	)
{
	int num_robots = 2;
	stopAll.store(0);
	int robotsleft;
	int m_count;
	int movement;
	int i, j, k;
	int wins[MAXROBOTS];
	int ties[MAXROBOTS];
	long counter{};

	r_debug = 0;  /* turns off full compile info */

	for (i = 0; i < num_robots; i++) {
		wins[i] = 0;
		ties[i] = 0;
	}

	for (m_count = 1; m_count <= matches; m_count++) {
		cppforth::Forth forth1{};
		InitForthRobot(forth1);
		InsertForthToInt(&forth1, 0);
		cppforth::Forth forth2{};
		InitForthRobot(forth2);
		InsertForthToInt(&forth2, 1);

		std::vector<std::future<void>> allServersThreads;
		allServersThreads.push_back(
			std::async([&forth1, &command1]{
			try{
				robotStatus[0] = StatusRun;
				forth1.ExecuteString(command1);
				robotStatus[0] = StatusException;
			}
			catch (...){
				robotStatus[0] = StatusException;
			}
		})
			);
		allServersThreads.push_back(
			std::async([&forth2, &command2]{
			try{
				robotStatus[1] = StatusRun;
				forth2.ExecuteString(command2);
				robotStatus[1] = StatusException;
			}
			catch (...){
				robotStatus[1] = StatusException;
			}
		})
			);

		for (i = 0; i < num_robots; i++) {
			init_robot(i);
			// robot_go should be here
			robots[i].status = ACTIVE;
		}
		rand_pos(num_robots);
		movement = MOTION_CYCLES;
		robotsleft = num_robots;
		counter = 0L;
		while (robotsleft > 1 && counter < limit) {
			robotsleft = 0;
			for (i = 0; i < num_robots; i++) {
				if (robots[i].status == ACTIVE) {
					robotsleft++;
					cur_robot = &robots[i];
				}
			}
			cycle(num_robots);

			if (--movement == 0) {
				counter += MOTION_CYCLES;
				movement = MOTION_CYCLES;
				move_robots(0);
				move_miss(0);
				for (i = 0; i < num_robots; i++) {
					for (j = 0; j < MIS_ROBOT; j++) {
						if (missiles[i][j].stat == EXPLODING) {
							count_miss(i, j);
						}
					}
				}
			}
		}

		/* allow any flying missiles to explode */
		while (1) {
			k = 0;
			for (i = 0; i < num_robots; i++) {
				for (j = 0; j < MIS_ROBOT; j++) {
					if (missiles[i][j].stat == FLYING) {
						k = 1;
					}
				}
			}
			if (k) {
				move_robots(0);
				move_miss(0);
			}
			else
				break;
		}

		k = 0;
		for (i = 0; i < num_robots; i++) {
			if (robots[i].status == ACTIVE) {
				k++;
			}
		}

		for (i = 0; i < num_robots; i++) {
			if (robots[i].status == ACTIVE) {
				if (k == 1)
					wins[i]++;
				else
					ties[i]++;
			}
		}
		stopAll.store(1);
		for (int i = 0; i < 10000; ++i){
			auto end = true;
			for (j = 0; j < 2; ++j){
				if (robotStatus[j] != StatusException){
					end = false;
				}
			}
			if (end)
				break;
			cycle(num_robots);
			std::this_thread::yield();
		}
		for (auto it = begin(allServersThreads); it != end(allServersThreads); ++it){
			try{
				(*it).get();
			}
			catch (std::exception &){
				;
			}
		}
		stopAll.store(0);
	}
	int result{};
	if (wins[0] > wins[1]) result = 1;
	else if(wins[0] < wins[1]) result = -1;
	return result; 

}